

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

shared_ptr<vmips::MemoryLocation> __thiscall vmips::Function::new_memory(Function *this,size_t size)

{
  long lVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 *puVar5;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::MemoryLocation> sVar6;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  (this->name)._M_dataplus._M_p = (pointer)0x0;
  puVar5 = (undefined8 *)operator_new(0x48);
  puVar5[1] = 0x100000001;
  *puVar5 = &PTR___Sp_counted_ptr_inplace_00132960;
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[8] = 0;
  puVar5[2] = 0xffffffffffffffff;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[6] = 0;
  puVar5[7] = 0;
  *(undefined4 *)(puVar5 + 8) = 0;
  (this->name)._M_string_length = (size_type)puVar5;
  (this->name)._M_dataplus._M_p = (pointer)(puVar5 + 2);
  puVar5[4] = in_RDX;
  lVar1 = *(long *)(size + 0x28);
  *(long *)(size + 0x28) = lVar1 + 1;
  puVar5[2] = lVar1;
  *(undefined4 *)(puVar5 + 8) = 1;
  puVar5[3] = 0xffffffffffffffff;
  get_special((vmips *)&local_38,s8);
  p_Var4 = p_Stack_30;
  uVar3 = local_38;
  pcVar2 = (this->name)._M_dataplus._M_p;
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar2 + 0x28);
  *(undefined8 *)(pcVar2 + 0x20) = uVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar2 + 0x28) = p_Var4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  std::
  vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ::push_back((vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
               *)(size + 0xf0),(value_type *)this);
  sVar6.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<vmips::MemoryLocation>)
         sVar6.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MemoryLocation> Function::new_memory(size_t size) {
    auto res = std::make_shared<MemoryLocation>();
    res->size = size;
    res->identifier = memory_count++;
    res->status = MemoryLocation::Undetermined;
    res->offset = -1;
    res->base = get_special(SpecialReg::s8);
    mem_blocks.push_back(res);
    return res;
}